

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<capnp::Orphan<capnp::compiler::Statement>_>::setCapacity
          (Vector<capnp::Orphan<capnp::compiler::Statement>_> *this,size_t newSize)

{
  Orphan<capnp::compiler::Statement> *pOVar1;
  Orphan<capnp::compiler::Statement> *pOVar2;
  RemoveConst<capnp::Orphan<capnp::compiler::Statement>_> *pRVar3;
  __off_t in_RDX;
  ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_> newBuilder;
  ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_> local_38;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 5)) {
    ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Orphan<capnp::compiler::Statement> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x20,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pOVar2 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pOVar1 = (this->builder).ptr; pOVar1 != pOVar2; pOVar1 = pOVar1 + 1) {
    ((local_38.pos)->builder).segment = (pOVar1->builder).segment;
    ((local_38.pos)->builder).capTable = (pOVar1->builder).capTable;
    ((local_38.pos)->builder).location = (pOVar1->builder).location;
    ((local_38.pos)->builder).tag.content = (pOVar1->builder).tag.content;
    (pOVar1->builder).segment = (SegmentBuilder *)0x0;
    (pOVar1->builder).location = (word *)0x0;
    local_38.pos = local_38.pos + 1;
  }
  ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_>::operator=(&this->builder,&local_38);
  pOVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  pOVar1 = local_38.ptr;
  if (local_38.ptr != (Orphan<capnp::compiler::Statement> *)0x0) {
    local_38.ptr = (Orphan<capnp::compiler::Statement> *)0x0;
    local_38.pos = (RemoveConst<capnp::Orphan<capnp::compiler::Statement>_> *)0x0;
    local_38.endPtr = (Orphan<capnp::compiler::Statement> *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pOVar1,0x20,(long)pRVar3 - (long)pOVar1 >> 5,
               (long)pOVar2 - (long)pOVar1 >> 5,
               ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Statement>,_false>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }